

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrtf.cpp
# Opt level: O3

pos_type __thiscall
anon_unknown.dwarf_1c14fa::databuf::seekpos(databuf *this,pos_type pos,openmode mode)

{
  long lVar1;
  
  lVar1 = pos._M_off;
  if ((-1 < lVar1 && (mode & (_S_out|_S_in)) == _S_in) &&
     (lVar1 <= *(long *)&this->field_0x18 - *(long *)&this->field_0x8)) {
    *(long *)&this->field_0x10 = *(long *)&this->field_0x8 + lVar1;
    return pos;
  }
  return (pos_type)ZEXT816(0xffffffffffffffff);
}

Assistant:

pos_type seekpos(pos_type pos, std::ios_base::openmode mode) override
    {
        // Simplified version of seekoff
        if((mode&std::ios_base::out) || !(mode&std::ios_base::in))
            return traits_type::eof();

        if(pos < 0 || pos > egptr()-eback())
            return traits_type::eof();

        setg(eback(), eback() + static_cast<size_t>(pos), egptr());
        return pos;
    }